

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitAtomicWait
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,AtomicWait *curr)

{
  Name memoryName;
  Name memory;
  undefined1 this_00 [8];
  char *curr_00;
  bool bVar1;
  ExpressionRunner<wasm::ModuleRunner> *pEVar2;
  Address memorySize_00;
  Literal *pLVar3;
  Literal local_1f0;
  Literal local_1d8;
  address64_t local_1c0;
  ModuleRunner *local_1b8;
  size_t sStack_1b0;
  uintptr_t local_1a8;
  address64_t local_1a0;
  undefined1 local_198 [8];
  Literal loaded;
  Literal local_178;
  Address local_160;
  Address addr;
  Address memorySize;
  undefined1 local_128 [8];
  MemoryInstanceInfo info;
  undefined1 local_108 [4];
  uint bytes;
  Flow timeout;
  Flow expected;
  undefined1 local_68 [8];
  Flow ptr;
  AtomicWait *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  ptr.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,pEVar2,*(Expression **)(ptr.breakTo.super_IString.str._M_str + 0x18));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&timeout.breakTo.super_IString.str._M_str,pEVar2,
               *(Expression **)(ptr.breakTo.super_IString.str._M_str + 0x20));
    bVar1 = Flow::breaking((Flow *)&timeout.breakTo.super_IString.str._M_str);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&timeout.breakTo.super_IString.str._M_str);
    }
    else {
      pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
      ExpressionRunner<wasm::ModuleRunner>::visit
                ((Flow *)local_108,pEVar2,
                 *(Expression **)(ptr.breakTo.super_IString.str._M_str + 0x28));
      bVar1 = Flow::breaking((Flow *)local_108);
      if (bVar1) {
        Flow::Flow(__return_storage_ptr__,(Flow *)local_108);
      }
      else {
        info.name.super_IString.str._M_str._4_4_ =
             wasm::Type::getByteSize((Type *)(ptr.breakTo.super_IString.str._M_str + 0x30));
        getMemoryInstanceInfo
                  ((MemoryInstanceInfo *)local_128,this,
                   (Name)((IString *)(ptr.breakTo.super_IString.str._M_str + 0x38))->str);
        addr.addr = (address64_t)info.instance;
        memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
        memory.super_IString.str._M_len = (size_t)info.instance;
        memorySize_00 = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_128,memory);
        curr_00 = ptr.breakTo.super_IString.str._M_str;
        this_00 = local_128;
        pLVar3 = Flow::getSingleValue((Flow *)local_68);
        wasm::Literal::Literal(&local_178,pLVar3);
        loaded.type.id = (uintptr_t)memorySize_00;
        local_160 = getFinalAddress<wasm::AtomicWait>
                              ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00,(AtomicWait *)curr_00
                               ,&local_178,info.name.super_IString.str._M_str._4_4_,memorySize_00);
        wasm::Literal::~Literal(&local_178);
        local_1a0 = local_160.addr;
        local_1a8 = *(uintptr_t *)(ptr.breakTo.super_IString.str._M_str + 0x30);
        local_1b8 = info.instance;
        sStack_1b0 = info.name.super_IString.str._M_len;
        memoryName.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
        memoryName.super_IString.str._M_len = (size_t)info.instance;
        local_1c0 = memorySize_00.addr;
        doAtomicLoad((Literal *)local_198,(ModuleRunnerBase<wasm::ModuleRunner> *)local_128,
                     local_160,info.name.super_IString.str._M_str._4_4_,(Type)local_1a8,memoryName,
                     memorySize_00);
        pLVar3 = Flow::getSingleValue((Flow *)&timeout.breakTo.super_IString.str._M_str);
        bVar1 = wasm::Literal::operator!=((Literal *)local_198,pLVar3);
        if (bVar1) {
          wasm::Literal::Literal(&local_1d8,1);
          Flow::Flow(__return_storage_ptr__,&local_1d8);
          wasm::Literal::~Literal(&local_1d8);
        }
        else {
          wasm::Literal::Literal(&local_1f0,0);
          Flow::Flow(__return_storage_ptr__,&local_1f0);
          wasm::Literal::~Literal(&local_1f0);
        }
        wasm::Literal::~Literal((Literal *)local_198);
      }
      Flow::~Flow((Flow *)local_108);
    }
    Flow::~Flow((Flow *)&timeout.breakTo.super_IString.str._M_str);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitAtomicWait(AtomicWait* curr) {
    NOTE_ENTER("AtomicWait");
    Flow ptr = self()->visit(curr->ptr);
    if (ptr.breaking()) {
      return ptr;
    }
    NOTE_EVAL1(ptr);
    auto expected = self()->visit(curr->expected);
    NOTE_EVAL1(expected);
    if (expected.breaking()) {
      return expected;
    }
    auto timeout = self()->visit(curr->timeout);
    NOTE_EVAL1(timeout);
    if (timeout.breaking()) {
      return timeout;
    }
    auto bytes = curr->expectedType.getByteSize();
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    auto addr = info.instance->getFinalAddress(
      curr, ptr.getSingleValue(), bytes, memorySize);
    auto loaded = info.instance->doAtomicLoad(
      addr, bytes, curr->expectedType, info.name, memorySize);
    NOTE_EVAL1(loaded);
    if (loaded != expected.getSingleValue()) {
      return Literal(int32_t(1)); // not equal
    }
    // TODO: add threads support!
    //       for now, just assume we are woken up
    return Literal(int32_t(0)); // woken up
  }